

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O1

void __thiscall
pbrt::BSSRDFTable::BSSRDFTable(BSSRDFTable *this,int nRhoSamples,int nRadiusSamples,Allocator alloc)

{
  int iVar1;
  size_t n;
  size_t sVar2;
  
  n = (size_t)nRhoSamples;
  (this->rhoSamples).alloc.memoryResource = alloc.memoryResource;
  (this->rhoSamples).ptr = (float *)0x0;
  (this->rhoSamples).nAlloc = 0;
  (this->rhoSamples).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->rhoSamples,n);
  if (nRhoSamples != 0) {
    memset((this->rhoSamples).ptr,0,n * 4);
  }
  (this->rhoSamples).nStored = n;
  sVar2 = (size_t)nRadiusSamples;
  (this->radiusSamples).alloc.memoryResource = alloc.memoryResource;
  (this->radiusSamples).ptr = (float *)0x0;
  (this->radiusSamples).nAlloc = 0;
  (this->radiusSamples).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->radiusSamples,sVar2)
  ;
  if (nRadiusSamples != 0) {
    memset((this->radiusSamples).ptr,0,sVar2 * 4);
  }
  (this->radiusSamples).nStored = sVar2;
  iVar1 = nRadiusSamples * nRhoSamples;
  sVar2 = (size_t)iVar1;
  (this->profile).alloc.memoryResource = alloc.memoryResource;
  (this->profile).ptr = (float *)0x0;
  (this->profile).nAlloc = 0;
  (this->profile).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->profile,sVar2);
  if (iVar1 != 0) {
    memset((this->profile).ptr,0,sVar2 * 4);
  }
  (this->profile).nStored = sVar2;
  (this->rhoEff).alloc.memoryResource = alloc.memoryResource;
  (this->rhoEff).ptr = (float *)0x0;
  (this->rhoEff).nAlloc = 0;
  (this->rhoEff).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->rhoEff,n);
  if (nRhoSamples != 0) {
    memset((this->rhoEff).ptr,0,n * 4);
  }
  (this->rhoEff).nStored = n;
  (this->profileCDF).alloc.memoryResource = alloc.memoryResource;
  (this->profileCDF).ptr = (float *)0x0;
  (this->profileCDF).nAlloc = 0;
  (this->profileCDF).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->profileCDF,sVar2);
  if (iVar1 != 0) {
    memset((this->profileCDF).ptr,0,sVar2 * 4);
  }
  (this->profileCDF).nStored = sVar2;
  return;
}

Assistant:

BSSRDFTable::BSSRDFTable(int nRhoSamples, int nRadiusSamples, Allocator alloc)
    : rhoSamples(nRhoSamples, alloc),
      radiusSamples(nRadiusSamples, alloc),
      profile(nRadiusSamples * nRhoSamples, alloc),
      rhoEff(nRhoSamples, alloc),
      profileCDF(nRadiusSamples * nRhoSamples, alloc) {}